

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O3

ssize_t __thiscall StaticContentsSock::Recv(StaticContentsSock *this,void *buf,size_t len,int flags)

{
  long lVar1;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (this->m_contents)._M_string_length - this->m_consumed;
  if (len <= __n) {
    __n = len;
  }
  memcpy(buf,(this->m_contents)._M_dataplus._M_p + this->m_consumed,__n);
  if ((flags & 2U) == 0) {
    this->m_consumed = this->m_consumed + __n;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __n;
  }
  __stack_chk_fail();
}

Assistant:

ssize_t Recv(void* buf, size_t len, int flags) const override
    {
        const size_t consume_bytes{std::min(len, m_contents.size() - m_consumed)};
        std::memcpy(buf, m_contents.data() + m_consumed, consume_bytes);
        if ((flags & MSG_PEEK) == 0) {
            m_consumed += consume_bytes;
        }
        return consume_bytes;
    }